

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

int nn_has_arg(nn_option *opt)

{
  nn_option_type nVar1;
  nn_option *opt_local;
  
  nVar1 = opt->type;
  if (nVar1 == NN_OPT_HELP) {
LAB_00104b84:
    opt_local._4_4_ = 0;
  }
  else {
    if (nVar1 != NN_OPT_INT) {
      if (nVar1 - NN_OPT_INCREMENT < 2) goto LAB_00104b84;
      if (nVar1 != NN_OPT_ENUM) {
        if (nVar1 == NN_OPT_SET_ENUM) goto LAB_00104b84;
        if (5 < nVar1 - NN_OPT_STRING) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                  ,0x45);
          fflush(_stderr);
          nn_err_abort();
        }
      }
    }
    opt_local._4_4_ = 1;
  }
  return opt_local._4_4_;
}

Assistant:

static int nn_has_arg (struct nn_option *opt)
{
    switch (opt->type) {
        case NN_OPT_INCREMENT:
        case NN_OPT_DECREMENT:
        case NN_OPT_SET_ENUM:
        case NN_OPT_HELP:
            return 0;
        case NN_OPT_ENUM:
        case NN_OPT_STRING:
        case NN_OPT_BLOB:
        case NN_OPT_FLOAT:
        case NN_OPT_INT:
        case NN_OPT_LIST_APPEND:
        case NN_OPT_LIST_APPEND_FMT:
        case NN_OPT_READ_FILE:
            return 1;
    }
    nn_assert (0);
}